

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeConflict
          (ConflictSet *this,LocalDomChg *locdomchg,HighsDomainChange *conflict,HighsInt len)

{
  pointer *ppLVar1;
  pointer pHVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pLVar6;
  pointer ppVar7;
  iterator __position;
  bool bVar8;
  bool bVar9;
  HighsDomain *pHVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  pointer ppVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  HighsDomainChange HVar19;
  LocalDomChg local_48;
  
  pLVar6 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar6) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar6;
  }
  HVar19 = flip(this->localdom,&locdomchg->domchg);
  if (len < 1) {
    bVar18 = true;
    bVar9 = false;
LAB_0029ac79:
    return (bool)(bVar9 & bVar18);
  }
  uVar14 = 0;
  bVar18 = false;
  bVar9 = false;
LAB_0029aa11:
  if (bVar9) {
    iVar11 = conflict[uVar14].column;
LAB_0029aa5c:
    dVar3 = conflict[uVar14].boundval;
    bVar8 = bVar9;
    if (conflict[uVar14].boundtype == kLower) {
      if ((this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11] < dVar3) {
        pHVar10 = this->localdom;
        ppVar15 = (pointer)((pHVar10->col_lower_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + iVar11);
        piVar13 = (pHVar10->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar11;
        ppVar7 = (pHVar10->prevboundval_).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_48.pos = *piVar13;
          lVar12 = (long)local_48.pos;
          if (local_48.pos < locdomchg->pos) {
            if (local_48.pos == -1) goto LAB_0029ac79;
            dVar4 = ppVar15->first;
            dVar5 = ppVar7[lVar12].first;
            if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) goto LAB_0029ab9c;
          }
          ppVar15 = ppVar7 + lVar12;
          piVar13 = &ppVar7[lVar12].second;
        } while( true );
      }
    }
    else if (dVar3 < (this->globaldom->col_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar11]) {
      pHVar10 = this->localdom;
      ppVar15 = (pointer)((pHVar10->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar11);
      piVar13 = (pHVar10->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar11;
      ppVar7 = (pHVar10->prevboundval_).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_48.pos = *piVar13;
        lVar12 = (long)local_48.pos;
        if (local_48.pos < locdomchg->pos) {
          if (local_48.pos == -1) goto LAB_0029ac79;
          dVar4 = ppVar15->first;
          dVar5 = ppVar7[lVar12].first;
          if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) goto LAB_0029ab6a;
        }
        ppVar15 = ppVar7 + lVar12;
        piVar13 = &ppVar7[lVar12].second;
      } while( true );
    }
  }
  else {
    iVar16 = HVar19.column;
    iVar11 = conflict[uVar14].column;
    if ((conflict[uVar14].column != iVar16) ||
       (iVar11 = iVar16, conflict[uVar14].boundtype != HVar19.boundtype)) goto LAB_0029aa5c;
    dVar3 = conflict[uVar14].boundval;
    if (HVar19._8_8_ >> 0x20 == 0) {
      bVar17 = HVar19.boundval < dVar3;
    }
    else {
      bVar17 = dVar3 < HVar19.boundval;
    }
    bVar8 = true;
    if (bVar17) goto LAB_0029aa5c;
  }
  goto LAB_0029ac5c;
LAB_0029ab9c:
  if (dVar4 < dVar3) goto LAB_0029ac79;
  while (dVar3 <= dVar5) {
    local_48.pos = ppVar7[lVar12].second;
    lVar12 = (long)local_48.pos;
    dVar5 = ppVar7[lVar12].first;
  }
  goto LAB_0029abd7;
LAB_0029ab6a:
  if (dVar3 < dVar4) goto LAB_0029ac79;
  while (dVar5 <= dVar3) {
    local_48.pos = ppVar7[lVar12].second;
    lVar12 = (long)local_48.pos;
    dVar5 = ppVar7[lVar12].first;
  }
LAB_0029abd7:
  pHVar2 = (pHVar10->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start + lVar12;
  local_48.domchg.boundval = pHVar2->boundval;
  local_48.domchg.column = pHVar2->column;
  local_48.domchg.boundtype = pHVar2->boundtype;
  __position._M_current =
       (this->resolvedDomainChanges).
       super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::_M_realloc_insert<HighsDomain::ConflictSet::LocalDomChg>
              (&this->resolvedDomainChanges,__position,&local_48);
  }
  else {
    ((__position._M_current)->domchg).column = local_48.domchg.column;
    ((__position._M_current)->domchg).boundtype = local_48.domchg.boundtype;
    *(ulong *)__position._M_current = CONCAT44(local_48._4_4_,local_48.pos);
    ((__position._M_current)->domchg).boundval = local_48.domchg.boundval;
    ppLVar1 = &(this->resolvedDomainChanges).
               super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
LAB_0029ac5c:
  bVar9 = bVar8;
  uVar14 = uVar14 + 1;
  bVar18 = (uint)len <= uVar14;
  if (uVar14 == (uint)len) goto LAB_0029ac79;
  goto LAB_0029aa11;
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeConflict(
    const LocalDomChg& locdomchg, const HighsDomainChange* conflict,
    HighsInt len) {
  resolvedDomainChanges.clear();
  auto domchg = localdom.flip(locdomchg.domchg);
  bool foundDomchg = false;
  for (HighsInt i = 0; i < len; ++i) {
    if (!foundDomchg && conflict[i].column == domchg.column &&
        conflict[i].boundtype == domchg.boundtype) {
      if (conflict[i].boundtype == HighsBoundType::kLower) {
        if (conflict[i].boundval <= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      } else {
        if (conflict[i].boundval >= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      }
    }
    if (globaldom.isActive(conflict[i])) continue;

    HighsInt pos;
    if (conflict[i].boundtype == HighsBoundType::kLower) {
      double lb =
          localdom.getColLowerPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || lb < conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first >= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    } else {
      double ub =
          localdom.getColUpperPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || ub > conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first <= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    }

    resolvedDomainChanges.push_back(
        LocalDomChg{pos, localdom.domchgstack_[pos]});
  }

  return foundDomchg;
}